

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O0

int lj_cf_table_maxn(lua_State *L)

{
  double dVar1;
  GCtab *pGVar2;
  ulong uVar3;
  long in_RDI;
  lua_Number n;
  ptrdiff_t i;
  lua_Number m;
  Node *node;
  TValue *array;
  GCtab *t;
  int in_stack_ffffffffffffffbc;
  lua_State *in_stack_ffffffffffffffc0;
  ulong local_38;
  double local_30;
  
  pGVar2 = lj_lib_checktab(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  local_30 = 0.0;
  local_38 = (ulong)pGVar2->asize;
  do {
    local_38 = local_38 - 1;
    if ((long)local_38 < 0) goto LAB_0018c2d0;
  } while (*(int *)((ulong)(pGVar2->array).ptr32 + 4 + local_38 * 8) == -1);
  local_30 = (double)(int)local_38;
LAB_0018c2d0:
  uVar3 = (ulong)(pGVar2->node).ptr32;
  for (local_38 = (ulong)pGVar2->hmask; -1 < (long)local_38; local_38 = local_38 - 1) {
    if (((*(int *)(uVar3 + local_38 * 0x18 + 4) != -1) &&
        (*(uint *)(uVar3 + local_38 * 0x18 + 0xc) < 0xffff0000)) &&
       (dVar1 = *(double *)(uVar3 + local_38 * 0x18 + 8), local_30 < dVar1)) {
      local_30 = dVar1;
    }
  }
  *(double *)(*(long *)(in_RDI + 0x18) + -8) = local_30;
  return 1;
}

Assistant:

LJLIB_CF(table_maxn)
{
  GCtab *t = lj_lib_checktab(L, 1);
  TValue *array = tvref(t->array);
  Node *node;
  lua_Number m = 0;
  ptrdiff_t i;
  for (i = (ptrdiff_t)t->asize - 1; i >= 0; i--)
    if (!tvisnil(&array[i])) {
      m = (lua_Number)(int32_t)i;
      break;
    }
  node = noderef(t->node);
  for (i = (ptrdiff_t)t->hmask; i >= 0; i--)
    if (!tvisnil(&node[i].val) && tvisnumber(&node[i].key)) {
      lua_Number n = numberVnum(&node[i].key);
      if (n > m) m = n;
    }
  setnumV(L->top-1, m);
  return 1;
}